

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFIn.cpp
# Opt level: O0

bool __thiscall NaPNFileInput::activate(NaPNFileInput *this)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  NaPetriNode *in_RDI;
  bool local_1;
  
  bVar1 = NaPetriNode::activate((NaPetriNode *)0x14cbf7);
  if (bVar1) {
    uVar3 = NaPetriNode::activations(in_RDI);
    if (uVar3 == 0) {
      bVar2 = (**(code **)(**(long **)&in_RDI[2].nActivations + 0x28))();
      local_1 = (bool)(bVar2 & 1);
    }
    else {
      bVar2 = (**(code **)(**(long **)&in_RDI[2].nActivations + 0x20))();
      local_1 = (bool)(bVar2 & 1);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
NaPNFileInput::activate ()
{
    // Check data is read by data destination connectors
    if(!NaPetriNode::activate())
        // Data must be stored until all destination connectors
        // would read them
        return false;

    // Return 'true' if there are data for reading or 'false' otherwise
    if(0 == activations())
        return pDataF->GoStartRecord();
    return pDataF->GoNextRecord();
}